

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

size_t __thiscall
frozen::bits::pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>>::
lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
          (pmh_tables<32ul,frozen::elsa<frozen::basic_string<char>>> *this,basic_string<char> *key,
          elsa<frozen::basic_string<char>_> *hasher)

{
  size_t sVar1;
  
  sVar1 = elsa<frozen::basic_string<char>_>::operator()(hasher,*key,*(size_t *)this);
  sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 0x1f) * 8 + 8);
  if ((long)sVar1 < 0) {
    sVar1 = elsa<frozen::basic_string<char>_>::operator()(hasher,*key,sVar1);
    sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 0x1f) * 8 + 0x108);
  }
  return sVar1;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }